

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O3

YV12_BUFFER_CONFIG *
av1_tf_info_get_filtered_buf(TEMPORAL_FILTER_INFO *tf_info,int gf_index,FRAME_DIFF *frame_diff)

{
  int64_t iVar1;
  bool bVar2;
  YV12_BUFFER_CONFIG *pYVar3;
  bool bVar4;
  long lVar5;
  
  if (tf_info->is_temporal_filter_on != 0) {
    lVar5 = 0;
    pYVar3 = (YV12_BUFFER_CONFIG *)0x0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      if ((tf_info->tf_buf_valid[lVar5] != 0) && (tf_info->tf_buf_gf_index[lVar5] == gf_index)) {
        pYVar3 = tf_info->tf_buf + lVar5;
        iVar1 = tf_info->frame_diff[lVar5].sse;
        frame_diff->sum = tf_info->frame_diff[lVar5].sum;
        frame_diff->sse = iVar1;
      }
      lVar5 = 1;
      bVar2 = false;
    } while (bVar4);
    return pYVar3;
  }
  return (YV12_BUFFER_CONFIG *)0x0;
}

Assistant:

YV12_BUFFER_CONFIG *av1_tf_info_get_filtered_buf(TEMPORAL_FILTER_INFO *tf_info,
                                                 int gf_index,
                                                 FRAME_DIFF *frame_diff) {
  if (tf_info->is_temporal_filter_on == 0) return NULL;
  YV12_BUFFER_CONFIG *out_buf = NULL;
  for (int i = 0; i < TF_INFO_BUF_COUNT; ++i) {
    if (tf_info->tf_buf_valid[i] && tf_info->tf_buf_gf_index[i] == gf_index) {
      out_buf = &tf_info->tf_buf[i];
      *frame_diff = tf_info->frame_diff[i];
    }
  }
  return out_buf;
}